

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O3

void __thiscall UnitTest_semantic19::Run(UnitTest_semantic19 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Terminator *pTVar2;
  Terminator *pTVar3;
  string local_70;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"if i == 1 then local i = 1 elseif j == 1 then local j = 1 end","")
  ;
  anon_unknown.dwarf_2f36d::Semantic((anon_unknown_dwarf_2f36d *)&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"i","");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_48,local_48 + local_40);
  pTVar2 = ASTFind<luna::Terminator,FindName>(&local_50,(FindName *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"j","");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_48,local_48 + local_40);
  pTVar3 = ASTFind<luna::Terminator,FindName>(&local_50,(FindName *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (pTVar2->scoping_ != LexicalScoping_Global) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"\'i->scoping_ == luna::LexicalScoping_Global\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (pTVar3->scoping_ != LexicalScoping_Global) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"\'j->scoping_ == luna::LexicalScoping_Global\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (local_50._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
      _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0) {
    (*(*(_func_int ***)
        local_50._M_t.
        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl)[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic19)
{
    auto ast = Semantic("if i == 1 then local i = 1 elseif j == 1 then local j = 1 end");
    auto i = ASTFind<luna::Terminator>(ast, FindName("i"));
    auto j = ASTFind<luna::Terminator>(ast, FindName("j"));
    EXPECT_TRUE(i->scoping_ == luna::LexicalScoping_Global);
    EXPECT_TRUE(j->scoping_ == luna::LexicalScoping_Global);
}